

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

parser_error parse_renderer_code(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  char *name;
  wchar_t ind;
  char *code;
  renderer_info *renderer;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getstr(p,"code");
    wVar1 = lookup_backend_by_name(name);
    if (wVar1 == L'\0') {
      p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
    }
    else {
      *(long *)((long)pvVar2 + 0x30) = (long)wVar1 * 0x38 + 0x2f3a98;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_renderer_code(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *code;
	int ind;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	code = parser_getstr(p, "code");
	ind = lookup_backend_by_name(code);
	if (ind == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	renderer->backend = backends + ind - 1;
	return PARSE_ERROR_NONE;
}